

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* split_coopmat_pointer
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *expr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  runtime_error *prVar5;
  int iVar6;
  size_type *local_90;
  size_type local_88;
  size_type local_80;
  undefined8 uStack_78;
  char *local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_90 = &local_80;
  pcVar3 = (expr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + expr->_M_string_length);
  local_70 = &local_60;
  local_68 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  local_60 = '\0';
  if (*(char *)((long)local_90 + (local_88 - 1)) != ']') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,"Access chain for coopmat must be indexed into an array.");
    *(undefined ***)prVar5 = &PTR__runtime_error_0048ff00;
    __cxa_throw(prVar5,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::pop_back();
  iVar6 = 1;
  do {
    if (local_88 == 0) goto LAB_002f98b3;
    cVar2 = *(char *)((long)local_90 + (local_88 - 1));
    iVar4 = -(uint)(cVar2 == '[');
    if (cVar2 == ']') {
      iVar4 = 1;
    }
    std::__cxx11::string::pop_back();
    iVar6 = iVar6 + iVar4;
  } while (iVar6 != 0);
  if (local_88 != 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)expr);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if (local_90 == &local_80) {
      paVar1->_M_allocated_capacity = local_80;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = uStack_78;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)local_90;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity = local_80;
    }
    (__return_storage_ptr__->first)._M_string_length = local_88;
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if (local_70 == &local_60) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_58;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_70;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    (__return_storage_ptr__->second)._M_string_length = (size_type)local_68;
    return local_68;
  }
LAB_002f98b3:
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Invalid pointer expression for coopmat.");
  *(undefined ***)prVar5 = &PTR__runtime_error_0048ff00;
  __cxa_throw(prVar5,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static pair<string, string> split_coopmat_pointer(const string &expr)
{
	auto ptr_expr = expr;
	string index_expr;

	if (ptr_expr.back() != ']')
		SPIRV_CROSS_THROW("Access chain for coopmat must be indexed into an array.");

	// Strip the access chain.
	ptr_expr.pop_back();
	uint32_t counter = 1;
	while (counter && !ptr_expr.empty())
	{
		if (ptr_expr.back() == ']')
			counter++;
		else if (ptr_expr.back() == '[')
			counter--;
		ptr_expr.pop_back();
	}

	if (ptr_expr.empty())
		SPIRV_CROSS_THROW("Invalid pointer expression for coopmat.");

	index_expr = expr.substr(ptr_expr.size() + 1, expr.size() - (ptr_expr.size() + 1) - 1);
	return { std::move(ptr_expr), std::move(index_expr) };
}